

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void __thiscall Memory::CacheAllocator::CheckIsAllZero(CacheAllocator *this,bool lockdown)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  char *pcVar6;
  BigBlock *pBVar7;
  ArenaMemoryBlock *pAVar8;
  DWORD local_40;
  DWORD local_3c;
  DWORD oldProtect;
  DWORD oldProtect_1;
  
  pAVar8 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
           super_ArenaData.mallocBlocks;
  _oldProtect = this;
  if (pAVar8 != (ArenaMemoryBlock *)0x0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      sVar1 = pAVar8->nbytes;
      if (sVar1 != 0) {
        if (*(char *)&pAVar8[1].field_0 == '\0') {
          if (sVar1 != 1) {
            iVar4 = bcmp(pAVar8 + 1,(void *)((long)&pAVar8[1].field_0 + 1),sVar1 - 1);
            if (iVar4 != 0) goto LAB_0069ebb6;
          }
        }
        else {
LAB_0069ebb6:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                             ,0x5f1,
                             "(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0))",
                             "IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0)");
          if (!bVar3) goto LAB_0069ede7;
          *puVar5 = 0;
        }
      }
      pAVar8 = (pAVar8->field_0).next;
    } while (pAVar8 != (ArenaMemoryBlock *)0x0);
  }
  if ((_oldProtect->verifiedAllZeroAndLockedDown & lockdown) == 0) {
    pBVar7 = (_oldProtect->
             super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.bigBlocks;
    if ((pBVar7 != (BigBlock *)0x0) &&
       (pcVar6 = (_oldProtect->
                 super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
                 super_ArenaData.cacheBlockCurrent + (-0x20 - (long)pBVar7),
       pcVar6 != (char *)pBVar7->currentByte)) {
      pBVar7->currentByte = (size_t)pcVar6;
    }
    pBVar7 = (_oldProtect->
             super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.bigBlocks;
    if (pBVar7 != (BigBlock *)0x0) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        sVar1 = pBVar7->currentByte;
        if (sVar1 != 0) {
          if (*(char *)&pBVar7[1].super_ArenaMemoryBlock.field_0 == '\0') {
            if (sVar1 != 1) {
              iVar4 = bcmp(pBVar7 + 1,(void *)((long)&pBVar7[1].super_ArenaMemoryBlock.field_0 + 1),
                           sVar1 - 1);
              if (iVar4 != 0) goto LAB_0069ec7b;
            }
          }
          else {
LAB_0069ec7b:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0x5fd,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                               "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
            if (!bVar3) goto LAB_0069ede7;
            *puVar5 = 0;
          }
        }
        if (lockdown) {
          VirtualProtect(pBVar7->allocation + 1,pBVar7->allocation->pageCount * 0x1000 - 0x10,2,
                         &local_40);
        }
        pBVar7 = (pBVar7->super_ArenaMemoryBlock).field_0.nextBigBlock;
      } while (pBVar7 != (BigBlock *)0x0);
    }
    pBVar7 = (_oldProtect->
             super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.fullBlocks;
    if (pBVar7 != (BigBlock *)0x0) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        sVar1 = pBVar7->currentByte;
        if (sVar1 != 0) {
          if (*(char *)&pBVar7[1].super_ArenaMemoryBlock.field_0 == '\0') {
            if (sVar1 != 1) {
              iVar4 = bcmp(pBVar7 + 1,(void *)((long)&pBVar7[1].super_ArenaMemoryBlock.field_0 + 1),
                           sVar1 - 1);
              if (iVar4 != 0) goto LAB_0069ed44;
            }
          }
          else {
LAB_0069ed44:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0x609,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                               "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
            if (!bVar3) {
LAB_0069ede7:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar5 = 0;
          }
        }
        if (lockdown) {
          VirtualProtect(pBVar7->allocation + 1,pBVar7->allocation->pageCount * 0x1000 - 0x10,2,
                         &local_3c);
        }
        pBVar7 = (pBVar7->super_ArenaMemoryBlock).field_0.nextBigBlock;
      } while (pBVar7 != (BigBlock *)0x0);
    }
    if (lockdown) {
      _oldProtect->verifiedAllZeroAndLockedDown = true;
    }
  }
  return;
}

Assistant:

void CacheAllocator::CheckIsAllZero(bool lockdown)
{
    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        Assert(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0));
        memoryBlock = memoryBlock->next;
    }

    if (verifiedAllZeroAndLockedDown && lockdown)
    {
        return;
    }
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    if (lockdown)
    {
        verifiedAllZeroAndLockedDown = true;
    }
}